

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzerSettings.cpp
# Opt level: O3

void __thiscall
ManchesterAnalyzerSettings::ManchesterAnalyzerSettings(ManchesterAnalyzerSettings *this)

{
  Channel *this_00;
  auto_ptr<AnalyzerSettingInterfaceChannel> *paVar1;
  AnalyzerSettingInterfaceChannel *this_01;
  AnalyzerSettingInterfaceNumberList *pAVar2;
  AnalyzerSettingInterfaceInteger *pAVar3;
  ostream *poVar4;
  AnalyzerSettingInterfaceChannel *pAVar5;
  AnalyzerSettingInterfaceInteger *pAVar6;
  AnalyzerSettingInterfaceNumberList *pAVar7;
  long lVar8;
  ulong uVar9;
  Channel *pCVar10;
  char *pcVar11;
  undefined *puVar12;
  uint uVar13;
  stringstream ss;
  char *local_1d8;
  char local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__ManchesterAnalyzerSettings_0010bd68;
  this_00 = &this->mInputChannel;
  uVar9 = 0xffffffffffffffff;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mMode = MANCHESTER;
  this->mBitRate = 0x5dc;
  this->mInverted = false;
  this->mBitsPerTransfer = 8;
  this->mShiftOrder = LsbFirst;
  this->mBitsToIgnore = 0;
  this->mTolerance = TOL25;
  paVar1 = &this->mInputChannelInterface;
  (this->mInputChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mModeInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mBitRateInterface)._M_ptr = (AnalyzerSettingInterfaceInteger *)0x0;
  (this->mInvertedInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mBitsPerTransferInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mShiftOrderInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mNumBitsIgnoreInterface)._M_ptr = (AnalyzerSettingInterfaceInteger *)0x0;
  (this->mToleranceInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  this_01 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar9);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_01);
  pAVar5 = paVar1->_M_ptr;
  if (pAVar5 != this_01) {
    if (pAVar5 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar5 + 8))();
    }
    paVar1->_M_ptr = this_01;
    pAVar5 = this_01;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar5,"Manchester");
  pCVar10 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)paVar1->_M_ptr);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar10);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  pAVar7 = (this->mModeInterface)._M_ptr;
  if (pAVar7 != pAVar2) {
    if (pAVar7 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar7 + 8))();
    }
    (this->mModeInterface)._M_ptr = pAVar2;
    pAVar7 = pAVar2;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar7,"Mode");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mModeInterface)._M_ptr,"Manchester");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mModeInterface)._M_ptr,"Differential Manchester");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(this->mModeInterface)._M_ptr,"Bi-Phase Mark Code (FM1)");
  pcVar11 = "Bi-Phase Space Code (FM0)";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (3.0,(char *)(this->mModeInterface)._M_ptr,"Bi-Phase Space Code (FM0)");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mMode);
  pAVar3 = (AnalyzerSettingInterfaceInteger *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar11);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(pAVar3);
  pAVar6 = (this->mBitRateInterface)._M_ptr;
  if (pAVar6 != pAVar3) {
    if (pAVar6 != (AnalyzerSettingInterfaceInteger *)0x0) {
      (**(code **)(*(long *)pAVar6 + 8))();
    }
    (this->mBitRateInterface)._M_ptr = pAVar3;
    pAVar6 = pAVar3;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar6,"Bit Rate (Bits/s)");
  AnalyzerSettingInterfaceInteger::SetMax((int)(this->mBitRateInterface)._M_ptr);
  AnalyzerSettingInterfaceInteger::SetMin((int)(this->mBitRateInterface)._M_ptr);
  uVar9 = (ulong)this->mBitRate;
  AnalyzerSettingInterfaceInteger::SetInteger((int)(this->mBitRateInterface)._M_ptr);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar9);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  pAVar7 = (this->mInvertedInterface)._M_ptr;
  if (pAVar7 != pAVar2) {
    if (pAVar7 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar7 + 8))();
    }
    (this->mInvertedInterface)._M_ptr = pAVar2;
    pAVar7 = pAVar2;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar7,"Edge Polarity");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mInvertedInterface)._M_ptr,"negative edge is binary one");
  pcVar11 = "negative edge is binary zero";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mInvertedInterface)._M_ptr,"negative edge is binary zero");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)(int)this->mInverted);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar11);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  pAVar7 = (this->mBitsPerTransferInterface)._M_ptr;
  if (pAVar7 != pAVar2) {
    if (pAVar7 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar7 + 8))();
    }
    (this->mBitsPerTransferInterface)._M_ptr = pAVar2;
    pAVar7 = pAVar2;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar7,"Bits Per Frame");
  lVar8 = 1;
  do {
    std::__cxx11::stringstream::stringstream(local_1b8);
    pcVar11 = "1 Bit per Transfer";
    poVar4 = local_1a8;
    if (lVar8 != 1) {
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      pcVar11 = " Bits per Transfer";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar11,0x12);
    pAVar7 = (this->mBitsPerTransferInterface)._M_ptr;
    std::__cxx11::stringbuf::str();
    AnalyzerSettingInterfaceNumberList::AddNumber((double)(int)lVar8,(char *)pAVar7,local_1d8);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8);
    }
    puVar12 = &std::__cxx11::stringstream::VTT;
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x41);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mBitsPerTransfer);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)puVar12);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  pAVar7 = (this->mShiftOrderInterface)._M_ptr;
  if (pAVar7 != pAVar2) {
    if (pAVar7 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar7 + 8))();
    }
    (this->mShiftOrderInterface)._M_ptr = pAVar2;
    pAVar7 = pAVar2;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar7,"Significant Bit");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mShiftOrderInterface)._M_ptr,"Least Significant Bit Sent First");
  pcVar11 = "Most Significant Bit Sent First";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mShiftOrderInterface)._M_ptr,"Most Significant Bit Sent First");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mShiftOrder);
  pAVar3 = (AnalyzerSettingInterfaceInteger *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar11);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(pAVar3);
  pAVar6 = (this->mNumBitsIgnoreInterface)._M_ptr;
  if (pAVar6 != pAVar3) {
    if (pAVar6 != (AnalyzerSettingInterfaceInteger *)0x0) {
      (**(code **)(*(long *)pAVar6 + 8))();
    }
    (this->mNumBitsIgnoreInterface)._M_ptr = pAVar3;
    pAVar6 = pAVar3;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar6,"Preamble bits to ignore");
  AnalyzerSettingInterfaceInteger::SetMax((int)(this->mNumBitsIgnoreInterface)._M_ptr);
  AnalyzerSettingInterfaceInteger::SetMin((int)(this->mNumBitsIgnoreInterface)._M_ptr);
  uVar9 = (ulong)this->mBitsToIgnore;
  AnalyzerSettingInterfaceInteger::SetInteger((int)(this->mNumBitsIgnoreInterface)._M_ptr);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar9);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  pAVar7 = (this->mToleranceInterface)._M_ptr;
  if (pAVar7 != pAVar2) {
    if (pAVar7 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar7 + 8))();
    }
    (this->mToleranceInterface)._M_ptr = pAVar2;
    pAVar7 = pAVar2;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar7,"Tolerance");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mToleranceInterface)._M_ptr,"25% of period (default)");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mToleranceInterface)._M_ptr,"5% of period");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(this->mToleranceInterface)._M_ptr,"0.5% of period");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mTolerance);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar13 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar13,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar13,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar13,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  return;
}

Assistant:

ManchesterAnalyzerSettings::ManchesterAnalyzerSettings()
    : mInputChannel( UNDEFINED_CHANNEL ),
      mMode( MANCHESTER ),
      mBitRate( 1500 ),
      mInverted( false ),
      mBitsPerTransfer( 8 ),
      mShiftOrder( AnalyzerEnums::LsbFirst ),
      mBitsToIgnore( 0 ),
      mTolerance( TOL25 )
{
    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "Manchester", "Manchester" );
    mInputChannelInterface->SetChannel( mInputChannel );

    mModeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mModeInterface->SetTitleAndTooltip( "Mode", "Specify the Manchester Mode" );
    mModeInterface->AddNumber( MANCHESTER, "Manchester", "" );
    mModeInterface->AddNumber( DIFFERENTIAL_MANCHESTER, "Differential Manchester", "" );
    mModeInterface->AddNumber( BI_PHASE_MARK, "Bi-Phase Mark Code (FM1)", "" );
    mModeInterface->AddNumber( BI_PHASE_SPACE, "Bi-Phase Space Code (FM0)", "" );
    mModeInterface->SetNumber( mMode );

    mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mBitRateInterface->SetTitleAndTooltip( "Bit Rate (Bits/s)", "Specify the bit rate in bits per second." );
    mBitRateInterface->SetMax( 100000000 );
    mBitRateInterface->SetMin( 1 );
    mBitRateInterface->SetInteger( mBitRate );

    mInvertedInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mInvertedInterface->SetTitleAndTooltip( "Edge Polarity", "Specify the Manchester edge polarity (Normal Manchester mode only)" );
    mInvertedInterface->AddNumber( false, "negative edge is binary one", "" );
    mInvertedInterface->AddNumber( true, "negative edge is binary zero", "" );
    mInvertedInterface->SetNumber( mInverted );

    mBitsPerTransferInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mBitsPerTransferInterface->SetTitleAndTooltip( "Bits Per Frame", "Select the number of bits per frame" );
    for( U32 i = 1; i <= 64; i++ )
    {
        std::stringstream ss;

        if( i == 1 )
            ss << "1 Bit per Transfer";
        else
            ss << i << " Bits per Transfer";

        mBitsPerTransferInterface->AddNumber( i, ss.str().c_str(), "" );
    }
    mBitsPerTransferInterface->SetNumber( mBitsPerTransfer );

    mShiftOrderInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mShiftOrderInterface->SetTitleAndTooltip( "Significant Bit",
                                              "Select if the most significant bit or least significant bit is transmitted first" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::LsbFirst, "Least Significant Bit Sent First", "" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::MsbFirst, "Most Significant Bit Sent First", "" );
    mShiftOrderInterface->SetNumber( mShiftOrder );


    mNumBitsIgnoreInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mNumBitsIgnoreInterface->SetTitleAndTooltip( "Preamble bits to ignore", "Specify the number of preamble bits to ignore." );
    mNumBitsIgnoreInterface->SetMax( 1000 );
    mNumBitsIgnoreInterface->SetMin( 0 );
    mNumBitsIgnoreInterface->SetInteger( mBitsToIgnore );

    mToleranceInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mToleranceInterface->SetTitleAndTooltip( "Tolerance", "Specify the Manchester Tolerance as a percentage of period" );
    mToleranceInterface->AddNumber( TOL25, "25% of period (default)", "Maximum allowed tolerance, +- 50% of one half period" );
    mToleranceInterface->AddNumber( TOL5, "5% of period", "Required more than 10x over sampling" );
    mToleranceInterface->AddNumber( TOL05, "0.5% of period", "Requires more than 200x over sampling" );
    mToleranceInterface->SetNumber( mTolerance );

    AddInterface( mInputChannelInterface.get() );
    AddInterface( mModeInterface.get() );
    AddInterface( mBitRateInterface.get() );
    AddInterface( mInvertedInterface.get() );
    AddInterface( mBitsPerTransferInterface.get() );
    AddInterface( mShiftOrderInterface.get() );
    AddInterface( mNumBitsIgnoreInterface.get() );
    AddInterface( mToleranceInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "Manchester", false );
}